

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

NTrodeObj * __thiscall
TrodesConfig::getNTrode(NTrodeObj *__return_storage_ptr__,TrodesConfig *this,int index)

{
  pointer pNVar1;
  pointer pcVar2;
  
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (int)((ulong)((long)(this->nTrodes).
                                  super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
              0x38e38e39) {
    (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
         (_func_int **)&PTR__NTrodeObj_003edd18;
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    pcVar2 = pNVar1[index].id._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->id,pcVar2,
               pcVar2 + pNVar1[index].id._M_string_length);
    __return_storage_ptr__->index = pNVar1[index].index;
    std::vector<int,_std::allocator<int>_>::vector
              (&__return_storage_ptr__->hw_chans,&pNVar1[index].hw_chans);
  }
  else {
    NTrodeObj::NTrodeObj(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NTrodeObj TrodesConfig::getNTrode(int index) const{
    if (index >= (int)nTrodes.size()) {
        return NTrodeObj();
    }
    return(nTrodes[index]);
}